

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_utctm.cc
# Opt level: O3

ASN1_UTCTIME * ASN1_UTCTIME_adj(ASN1_UTCTIME *s,time_t t,int offset_day,long offset_sec)

{
  uint uVar1;
  int iVar2;
  ASN1_UTCTIME *str;
  size_t sVar3;
  tm data;
  char buf [14];
  
  iVar2 = OPENSSL_posix_to_tm(t,&data);
  if ((iVar2 != 0) &&
     (((offset_day == 0 && offset_sec == 0 ||
       (iVar2 = OPENSSL_gmtime_adj(&data,offset_day,offset_sec), iVar2 != 0)) &&
      (0xffffff9b < data.tm_year - 0x96U)))) {
    uVar1 = data.tm_year - 100;
    if ((uint)data.tm_year < 100) {
      uVar1 = data.tm_year;
    }
    iVar2 = snprintf(buf,0xe,"%02d%02d%02d%02d%02d%02dZ",(ulong)uVar1,(ulong)(data.tm_mon + 1),
                     (ulong)(uint)data.tm_mday,(ulong)(uint)data.tm_hour,(ulong)(uint)data.tm_min,
                     (ulong)(uint)data.tm_sec);
    if (iVar2 != 0xd) {
      abort();
    }
    str = s;
    if ((s != (ASN1_UTCTIME *)0x0) || (str = ASN1_UTCTIME_new(), str != (ASN1_UTCTIME *)0x0)) {
      sVar3 = strlen(buf);
      iVar2 = ASN1_STRING_set(str,buf,(int)sVar3);
      if (iVar2 != 0) {
        str->type = 0x17;
        return str;
      }
      if (s == (ASN1_UTCTIME *)0x0) {
        ASN1_UTCTIME_free(str);
      }
    }
  }
  return (ASN1_UTCTIME *)0x0;
}

Assistant:

ASN1_UTCTIME *ASN1_UTCTIME_adj(ASN1_UTCTIME *s, int64_t posix_time,
                               int offset_day, long offset_sec) {
  struct tm data;
  if (!OPENSSL_posix_to_tm(posix_time, &data)) {
    return NULL;
  }

  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&data, offset_day, offset_sec)) {
      return NULL;
    }
  }

  if (data.tm_year < 50 || data.tm_year >= 150) {
    return NULL;
  }

  char buf[14];
  int ret = snprintf(buf, sizeof(buf), "%02d%02d%02d%02d%02d%02dZ",
                     data.tm_year % 100, data.tm_mon + 1, data.tm_mday,
                     data.tm_hour, data.tm_min, data.tm_sec);
  // |snprintf| must write exactly 15 bytes (plus the NUL) to the buffer.
  BSSL_CHECK(ret == static_cast<int>(sizeof(buf) - 1));

  int free_s = 0;
  if (s == NULL) {
    free_s = 1;
    s = ASN1_UTCTIME_new();
    if (s == NULL) {
      return NULL;
    }
  }

  if (!ASN1_STRING_set(s, buf, strlen(buf))) {
    if (free_s) {
      ASN1_UTCTIME_free(s);
    }
    return NULL;
  }
  s->type = V_ASN1_UTCTIME;
  return s;
}